

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_NewGlobalCConstructor2(JSContext *ctx,JSValue func_obj,char *name,JSValue proto)

{
  JSRefCountHeader *p;
  
  if (0xfffffff4 < (uint)func_obj.tag) {
    *(int *)func_obj.u.ptr = *func_obj.u.ptr + 1;
  }
  JS_DefinePropertyValueStr(ctx,ctx->global_obj,name,func_obj,3);
  JS_SetConstructor(ctx,func_obj,proto);
  JS_FreeValue(ctx,func_obj);
  return;
}

Assistant:

static void JS_NewGlobalCConstructor2(JSContext *ctx,
                                      JSValue func_obj,
                                      const char *name,
                                      JSValueConst proto)
{
    JS_DefinePropertyValueStr(ctx, ctx->global_obj, name,
                           JS_DupValue(ctx, func_obj),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    JS_SetConstructor(ctx, func_obj, proto);
    JS_FreeValue(ctx, func_obj);
}